

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O3

void __thiscall
ExprVisitorTest_VisitPLTerm_Test::~ExprVisitorTest_VisitPLTerm_Test
          (ExprVisitorTest_VisitPLTerm_Test *this)

{
  (this->super_ExprVisitorTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprVisitorTest_001e1028
  ;
  testing::StrictMock<MockVisitor>::~StrictMock(&(this->super_ExprVisitorTest).visitor_);
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            (&(this->super_ExprVisitorTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1cd0);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitPLTerm) {
  auto builder = factory_.BeginPLTerm(1);
  builder.AddSlope(-1);
  builder.AddBreakpoint(0);
  builder.AddSlope(1);
  auto e = factory_.EndPLTerm(builder, var_);
  EXPECT_CALL(visitor_, VisitPLTerm(e));
  mp::NumericExpr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED_NUMERIC(base);
}